

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O3

void P_SerializePolyobjs(FArchive *arc)

{
  DWORD DVar1;
  FArchive *pFVar2;
  int iVar3;
  TObjPtr<DInterpolation> *object;
  DAngle *ang;
  int data;
  int seg;
  DAngle angle;
  DWORD local_5c;
  DVector2 local_58;
  DAngle local_40;
  DAngle local_38;
  
  if (arc->m_Storing == true) {
    local_58.X = (double)CONCAT44(local_58.X._4_4_,0x68);
    pFVar2 = FArchive::operator<<(arc,(DWORD *)&local_58);
    FArchive::operator<<(pFVar2,(DWORD *)&po_NumPolyobjs);
    if (0 < po_NumPolyobjs) {
      ang = &polyobjs->Angle;
      iVar3 = 0;
      do {
        pFVar2 = FArchive::operator<<(arc,(DWORD *)(ang + 1));
        pFVar2 = operator<<(pFVar2,ang);
        pFVar2 = operator<<(pFVar2,(DVector2 *)(ang + -10));
        pFVar2 = FArchive::SerializeObject
                           (pFVar2,(DObject **)(ang + 9),DInterpolation::RegistrationInfo.MyClass);
        pFVar2 = FArchive::operator<<(pFVar2,(bool *)((long)(ang + 4) + 5));
        FArchive::operator<<(pFVar2,(BYTE *)((long)(ang + 4) + 6));
        FArchive::SerializeObject(arc,(DObject **)(ang + 8),DPolyAction::RegistrationInfo.MyClass);
        iVar3 = iVar3 + 1;
        ang = ang + 0x1e;
      } while (iVar3 < po_NumPolyobjs);
    }
  }
  else {
    FArchive::operator<<(arc,&local_5c);
    if (local_5c != 0x68) {
      I_Error("Polyobject marker missing");
    }
    FArchive::operator<<(arc,&local_5c);
    DVar1 = local_5c;
    if (local_5c != po_NumPolyobjs) {
      I_Error("UnarchivePolyobjs: Bad polyobj count");
      DVar1 = po_NumPolyobjs;
    }
    if (0 < (int)DVar1) {
      object = &polyobjs->interpolation;
      iVar3 = 0;
      do {
        FArchive::operator<<(arc,&local_5c);
        if (local_5c != *(DWORD *)(object + -8)) {
          I_Error("UnarchivePolyobjs: Invalid polyobj tag");
        }
        pFVar2 = operator<<(arc,&local_38);
        pFVar2 = operator<<(pFVar2,&local_58);
        FArchive::SerializeObject
                  (pFVar2,(DObject **)object,DInterpolation::RegistrationInfo.MyClass);
        FArchive::operator<<(arc,(bool *)((long)(object + -5) + 5));
        FArchive::operator<<(arc,(BYTE *)((long)(object + -5) + 6));
        if (0x11c3 < SaveVersion) {
          FArchive::SerializeObject
                    (arc,(DObject **)(object + -1),DPolyAction::RegistrationInfo.MyClass);
        }
        local_40.Degrees = local_38.Degrees;
        FPolyObj::RotatePolyobj((FPolyObj *)(object + -0x1d),&local_40,true);
        local_58.X = local_58.X - (((FPolyVertex *)(object + -0x13))->pos).X;
        local_58.Y = local_58.Y - *(double *)(object + -0x12);
        FPolyObj::MovePolyobj((FPolyObj *)(object + -0x1d),&local_58,true);
        iVar3 = iVar3 + 1;
        object = object + 0x1e;
      } while (iVar3 < po_NumPolyobjs);
    }
  }
  return;
}

Assistant:

void P_SerializePolyobjs (FArchive &arc)
{
	int i;
	FPolyObj *po;

	if (arc.IsStoring ())
	{
		int seg = ASEG_POLYOBJS;
		arc << seg << po_NumPolyobjs;
		for(i = 0, po = polyobjs; i < po_NumPolyobjs; i++, po++)
		{
			arc << po->tag << po->Angle << po->StartSpot.pos << po->interpolation << po->bBlocked << po->bHasPortals;
			arc << po->specialdata;
  		}
	}
	else
	{
		int data;
		DAngle angle;
		DVector2 delta;

		arc << data;
		if (data != ASEG_POLYOBJS)
			I_Error ("Polyobject marker missing");

		arc << data;
		if (data != po_NumPolyobjs)
		{
			I_Error ("UnarchivePolyobjs: Bad polyobj count");
		}
		for (i = 0, po = polyobjs; i < po_NumPolyobjs; i++, po++)
		{
			arc << data;
			if (data != po->tag)
			{
				I_Error ("UnarchivePolyobjs: Invalid polyobj tag");
			}
			arc << angle << delta << po->interpolation;
			arc << po->bBlocked;
			arc << po->bHasPortals;
			if (SaveVersion >= 4548)
			{
				arc << po->specialdata;
			}

			po->RotatePolyobj (angle, true);
			delta -= po->StartSpot.pos;
			po->MovePolyobj (delta, true);
		}
	}
}